

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_disjoint_timer_query(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_disjoint_timer_query != 0) {
    glad_glGenQueriesEXT = (PFNGLGENQUERIESEXTPROC)(*load)("glGenQueriesEXT");
    glad_glDeleteQueriesEXT = (PFNGLDELETEQUERIESEXTPROC)(*load)("glDeleteQueriesEXT");
    glad_glIsQueryEXT = (PFNGLISQUERYEXTPROC)(*load)("glIsQueryEXT");
    glad_glBeginQueryEXT = (PFNGLBEGINQUERYEXTPROC)(*load)("glBeginQueryEXT");
    glad_glEndQueryEXT = (PFNGLENDQUERYEXTPROC)(*load)("glEndQueryEXT");
    glad_glQueryCounterEXT = (PFNGLQUERYCOUNTEREXTPROC)(*load)("glQueryCounterEXT");
    glad_glGetQueryivEXT = (PFNGLGETQUERYIVEXTPROC)(*load)("glGetQueryivEXT");
    glad_glGetQueryObjectivEXT = (PFNGLGETQUERYOBJECTIVEXTPROC)(*load)("glGetQueryObjectivEXT");
    glad_glGetQueryObjectuivEXT = (PFNGLGETQUERYOBJECTUIVEXTPROC)(*load)("glGetQueryObjectuivEXT");
    glad_glGetQueryObjecti64vEXT =
         (PFNGLGETQUERYOBJECTI64VEXTPROC)(*load)("glGetQueryObjecti64vEXT");
    glad_glGetQueryObjectui64vEXT =
         (PFNGLGETQUERYOBJECTUI64VEXTPROC)(*load)("glGetQueryObjectui64vEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_disjoint_timer_query(GLADloadproc load) {
	if(!GLAD_GL_EXT_disjoint_timer_query) return;
	glad_glGenQueriesEXT = (PFNGLGENQUERIESEXTPROC)load("glGenQueriesEXT");
	glad_glDeleteQueriesEXT = (PFNGLDELETEQUERIESEXTPROC)load("glDeleteQueriesEXT");
	glad_glIsQueryEXT = (PFNGLISQUERYEXTPROC)load("glIsQueryEXT");
	glad_glBeginQueryEXT = (PFNGLBEGINQUERYEXTPROC)load("glBeginQueryEXT");
	glad_glEndQueryEXT = (PFNGLENDQUERYEXTPROC)load("glEndQueryEXT");
	glad_glQueryCounterEXT = (PFNGLQUERYCOUNTEREXTPROC)load("glQueryCounterEXT");
	glad_glGetQueryivEXT = (PFNGLGETQUERYIVEXTPROC)load("glGetQueryivEXT");
	glad_glGetQueryObjectivEXT = (PFNGLGETQUERYOBJECTIVEXTPROC)load("glGetQueryObjectivEXT");
	glad_glGetQueryObjectuivEXT = (PFNGLGETQUERYOBJECTUIVEXTPROC)load("glGetQueryObjectuivEXT");
	glad_glGetQueryObjecti64vEXT = (PFNGLGETQUERYOBJECTI64VEXTPROC)load("glGetQueryObjecti64vEXT");
	glad_glGetQueryObjectui64vEXT = (PFNGLGETQUERYOBJECTUI64VEXTPROC)load("glGetQueryObjectui64vEXT");
}